

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeSelect(OptimizeInstructions *this,Select *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  matched_t<wasm::Const_*> pCVar3;
  Expression *pEVar4;
  int *piVar5;
  Expression *b;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  matcher;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  matcher_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [48];
  undefined1 auVar8 [48];
  Matcher<wasm::Match::Internal::ExactKind<int>_> MVar9;
  undefined1 auVar10 [8];
  bool bVar11;
  Id IVar12;
  BinaryOp BVar13;
  Index IVar14;
  uint uVar15;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> casted_2;
  Expression *pEVar16;
  Drop *pDVar17;
  Block *pBVar18;
  Unary *pUVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *this_01;
  Binary *pBVar20;
  long lVar21;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> casted_3;
  undefined8 *puVar22;
  undefined8 *puVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  undefined8 in_stack_fffffffffffff9c8;
  undefined8 in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  undefined8 in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  undefined8 local_5f0 [2];
  undefined8 local_5e0;
  undefined1 local_5d0 [16];
  undefined1 local_5a8 [72];
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_560;
  undefined8 local_550 [2];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  Literal local_500;
  undefined1 local_4e8 [8];
  Type type;
  bool local_3f8;
  undefined1 local_378 [24];
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  local_360;
  undefined8 local_348;
  undefined8 uStack_340;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *local_338;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *pMStack_330;
  undefined1 *local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *local_308;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *pMStack_300;
  undefined1 *local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [8];
  Const *c_1;
  undefined1 local_2d8 [16];
  Matcher<wasm::Match::Internal::ExactKind<int>_> local_2c8;
  bool local_1f8;
  undefined1 local_178 [8];
  Expression *y;
  undefined8 *local_168;
  undefined1 *local_160;
  undefined1 local_150 [8];
  Expression *c;
  anon_union_16_5_9943fe1e_for_Literal_0 local_140;
  Type local_130;
  pointer local_128;
  undefined1 local_108 [8];
  Expression *x;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_f8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *local_f0;
  undefined1 local_e0 [8];
  int32_t cond;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_d0;
  Expression *local_98;
  Binary *bin;
  Expression *x_1;
  undefined1 local_80 [8];
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  local_78 [2];
  Expression *local_48;
  Builder local_40;
  Builder builder;
  
  local_2c8._12_4_ = SUB84((ulong)local_2c8.binder >> 0x20,0);
  bVar24 = 0;
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  pEVar16 = optimizeBoolean(this,curr->condition);
  curr->condition = pEVar16;
  local_2d8._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2c8._0_12_ = ZEXT812(0);
  local_2e8 = (undefined1  [8])0x0;
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
      && (bVar11 = Match::Internal::MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>::
                   operator()((MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)
                              local_4e8,curr->ifTrue,this), bVar11)) &&
     (pCVar3 = (matched_t<wasm::Const_*>)curr->condition,
     (pCVar3->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId))
  {
    pEVar16 = curr->ifFalse;
    if (local_2e8 != (undefined1  [8])0x0) {
      ((HeapType *)local_2e8)->id = (uintptr_t)pCVar3;
    }
    Literal::Literal((Literal *)local_4e8,&pCVar3->value);
    bVar11 = Match::Internal::
             Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
             ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                        *)local_2d8,(Literal *)local_4e8);
    Literal::~Literal((Literal *)local_4e8);
    if (bVar11) {
      return pEVar16;
    }
  }
  local_2d8._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2c8._0_12_ = ZEXT812(0);
  local_2e8 = (undefined1  [8])0x0;
  IVar12 = (curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id;
  if ((IVar12 == SelectId) && (curr->condition->_id == ConstId)) {
    pEVar16 = curr->ifTrue;
    local_48 = curr->ifFalse;
    Literal::Literal((Literal *)local_4e8,(Literal *)(curr->condition + 1));
    bVar11 = Match::Internal::
             Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
             ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                        *)local_2d8,(Literal *)local_4e8);
    Literal::~Literal((Literal *)local_4e8);
    if (bVar11) {
      pDVar17 = (Drop *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      (pDVar17->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar17->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar17->value = pEVar16;
      Drop::finalize(pDVar17);
      pBVar18 = Builder::makeBlock(&local_40,(Expression *)pDVar17);
      pEVar16 = local_48;
      goto LAB_00803d29;
    }
    IVar12 = (curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id;
  }
  local_2d8._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2c8.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)local_e0;
  local_2e8 = (undefined1  [8])0x0;
  if (IVar12 == SelectId) {
    pEVar16 = curr->ifTrue;
    bVar11 = Match::Internal::MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>::
             operator()((MatchSelf<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)local_4e8,
                        curr->ifFalse,this);
    if ((bVar11) &&
       (pCVar3 = (matched_t<wasm::Const_*>)curr->condition,
       (pCVar3->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)
       ) {
      if (local_2e8 != (undefined1  [8])0x0) {
        ((HeapType *)local_2e8)->id = (uintptr_t)pCVar3;
      }
      Literal::Literal((Literal *)local_4e8,&pCVar3->value);
      bVar11 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>
                          *)local_2d8,(Literal *)local_4e8);
      Literal::~Literal((Literal *)local_4e8);
      if (bVar11) {
        if (local_e0._0_4_ == 0) {
          __assert_fail("cond != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                        ,0xa1f,"Expression *wasm::OptimizeInstructions::optimizeSelect(Select *)");
        }
        return pEVar16;
      }
    }
  }
  local_2d8._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2c8._0_12_ = ZEXT812(0);
  local_2e8 = (undefined1  [8])0x0;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId) {
    local_108 = (undefined1  [8])curr->ifTrue;
    if (curr->ifFalse->_id == ConstId) {
      Literal::Literal((Literal *)local_4e8,(Literal *)(curr->ifFalse + 1));
      bVar11 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                          *)local_2d8,(Literal *)local_4e8);
      Literal::~Literal((Literal *)local_4e8);
      if (bVar11) {
        local_178 = (undefined1  [8])curr->condition;
        bVar11 = areConsecutiveInputsEqualAndFoldable
                           (this,(Expression *)local_108,(Expression *)local_178);
        if (bVar11) {
          return curr->ifTrue;
        }
      }
    }
  }
  local_2d8._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2c8._0_12_ = ZEXT812(0);
  local_2e8 = (undefined1  [8])0x0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
     && (curr->ifTrue->_id == ConstId)) {
    Literal::Literal((Literal *)local_4e8,(Literal *)(curr->ifTrue + 1));
    bVar11 = Match::Internal::
             Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
             ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>
                        *)local_2d8,(Literal *)local_4e8);
    Literal::~Literal((Literal *)local_4e8);
    if (!bVar11) goto LAB_00803a29;
    local_108 = (undefined1  [8])curr->ifFalse;
    local_178 = (undefined1  [8])curr->condition;
    bVar11 = areConsecutiveInputsEqualAndFoldable
                       (this,(Expression *)local_108,(Expression *)local_178);
    auVar10 = local_108;
    if (!bVar11) goto LAB_00803a29;
    pDVar17 = (Drop *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    (pDVar17->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar17->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar17->value = (Expression *)auVar10;
    Drop::finalize(pDVar17);
    pEVar16 = curr->ifTrue;
LAB_00803d14:
    pBVar18 = Builder::makeBlock(&local_40,(Expression *)pDVar17);
LAB_00803d29:
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar18->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar16);
    Block::finalize(pBVar18);
    return (Expression *)pBVar18;
  }
LAB_00803a29:
  local_2d8._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2e8 = (undefined1  [8])0x0;
  local_2c8.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
  local_2c8.data = 0;
  local_2c8._12_4_ = 0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
     && (curr->ifTrue->_id == ConstId)) {
    Literal::Literal((Literal *)local_4e8,(Literal *)(curr->ifTrue + 1));
    bVar11 = Match::Internal::
             Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
             ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                        *)local_2d8,(Literal *)local_4e8);
    Literal::~Literal((Literal *)local_4e8);
    if (!bVar11) goto LAB_00803aba;
    local_108 = (undefined1  [8])curr->ifFalse;
    pEVar16 = curr->condition;
    if ((pEVar16->_id != UnaryId) || (pEVar16[1]._id != MemoryGrowId)) goto LAB_00803aba;
    local_178 = (undefined1  [8])pEVar16[1].type.id;
LAB_00803b61:
    bVar11 = areConsecutiveInputsEqualAndFoldable
                       (this,(Expression *)local_108,(Expression *)local_178);
    if (bVar11) {
      return (&curr->ifTrue)[curr->condition->_id == UnaryId];
    }
  }
  else {
LAB_00803aba:
    local_5a8._0_8_ = local_108;
    local_80 = (undefined1  [8])local_5a8;
    local_78[0].curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_4e8;
    local_4e8 = (undefined1  [8])0x0;
    local_378._0_8_ = local_178;
    local_140.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_378;
    local_d0.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)0x0;
    local_e0 = (undefined1  [8])0x0;
    local_d0.next.next =
         (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          )0x0;
    local_78[0].next.curr =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)local_150;
    local_150 = (undefined1  [8])0x0;
    c._0_4_ = 0x29;
    bin = (Binary *)0x0;
    local_140.func.super_IString.str._M_str =
         (char *)(Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                  *)local_e0;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
    {
      local_108 = (undefined1  [8])curr->ifTrue;
      bVar11 = Match::Internal::
               Components<wasm::Select_*,_1,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
               ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                             *)local_78);
      if (bVar11) goto LAB_00803b61;
    }
  }
  local_2d8._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2e8 = (undefined1  [8])0x0;
  local_2c8.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
  local_2c8.data = 0;
  local_2c8._12_4_ = 0;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId) {
    local_108 = (undefined1  [8])curr->ifTrue;
    if (curr->ifFalse->_id != ConstId) goto LAB_00803c14;
    Literal::Literal((Literal *)local_4e8,(Literal *)(curr->ifFalse + 1));
    bVar11 = Match::Internal::
             Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
             ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                        *)local_2d8,(Literal *)local_4e8);
    Literal::~Literal((Literal *)local_4e8);
    if (((!bVar11) || (pEVar16 = curr->condition, pEVar16->_id != UnaryId)) ||
       (pEVar16[1]._id != MemoryGrowId)) goto LAB_00803c14;
    local_178 = (undefined1  [8])pEVar16[1].type.id;
LAB_00803cb1:
    bVar11 = areConsecutiveInputsEqualAndFoldable
                       (this,(Expression *)local_108,(Expression *)local_178);
    auVar10 = local_108;
    if (bVar11) {
      pDVar17 = (Drop *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      (pDVar17->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar17->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar17->value = (Expression *)auVar10;
      Drop::finalize(pDVar17);
      pEVar16 = (&curr->ifTrue)[curr->condition->_id == UnaryId];
      goto LAB_00803d14;
    }
  }
  else {
LAB_00803c14:
    local_80 = (undefined1  [8])local_4e8;
    local_4e8 = (undefined1  [8])0x0;
    local_5a8._0_8_ = local_108;
    local_78[0].curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_5a8;
    local_378._0_8_ = local_178;
    local_140.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_378;
    local_d0.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)0x0;
    local_e0 = (undefined1  [8])0x0;
    local_d0.next.next =
         (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          )0x0;
    local_d0.next.next._8_8_ = 0;
    local_78[0].next.curr =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)local_150;
    local_150 = (undefined1  [8])0x0;
    c._0_4_ = 0x29;
    bin = (Binary *)0x0;
    local_140._8_8_ =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_e0;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId)
    {
      bVar11 = Match::Internal::
               Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
               ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                             *)local_80);
      if (bVar11) goto LAB_00803cb1;
    }
  }
  local_2d8._0_8_ = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_2e8 = (undefined1  [8])0x0;
  local_2c8.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
  local_2c8.data = 0;
  local_2c8._12_4_ = 0;
  local_4e8 = (undefined1  [8])0x0;
  local_d0.next.next.curr = (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&bin;
  local_e0 = (undefined1  [8])0x0;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id == SelectId) {
    local_d0.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_2e8;
    local_d0.next.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_4e8;
    bin = (Binary *)local_150;
    bVar11 = Match::Internal::
             Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
             ::match(curr,&local_d0);
    auVar10 = local_150;
    if (!bVar11) {
      bVar11 = (curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id ==
               SelectId;
      goto LAB_00803e23;
    }
    pUVar19 = (Unary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
    (pUVar19->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar19->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar19->op = EqZInt32;
    pUVar19->value = (Expression *)auVar10;
    Unary::finalize(pUVar19);
    local_150 = (undefined1  [8])optimizeBoolean(this,(Expression *)pUVar19);
  }
  else {
    bVar11 = false;
LAB_00803e23:
    local_2d8._0_8_ =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_2c8 = (Matcher<wasm::Match::Internal::ExactKind<int>_>)(ZEXT816(1) << 0x40);
    local_2e8 = (undefined1  [8])0x0;
    local_4e8 = (undefined1  [8])0x0;
    local_d0.next.next.curr = (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&bin;
    local_e0 = (undefined1  [8])0x0;
    local_d0.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_2e8;
    local_d0.next.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_4e8;
    bin = (Binary *)local_150;
    if ((!bVar11) ||
       (bVar11 = Match::Internal::
                 Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                 ::match(curr,&local_d0), !bVar11)) {
      pEVar16 = curr->condition;
      if ((pEVar16->_id == BinaryId) &&
         (BVar13 = invertBinaryOp(this,pEVar16[1]._id), BVar13 != InvalidBinary)) {
        local_48 = (Expression *)CONCAT44(local_48._4_4_,BVar13);
        local_2e8 = (undefined1  [8])0x0;
        local_2d8._0_8_ =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
        local_2c8.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
        local_2c8.data = 0;
        local_2c8._12_4_ = 0;
        MVar9 = local_2c8;
        local_2c8._8_8_ = 0;
        if (curr->ifTrue->_id == ConstId) {
          local_2c8 = MVar9;
          Literal::Literal((Literal *)local_4e8,(Literal *)(curr->ifTrue + 1));
          builder.wasm._7_1_ =
               Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
               ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                          *)local_2d8,
                         (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                          *)local_4e8);
          Literal::~Literal((Literal *)local_4e8);
          if (builder.wasm._7_1_ == '\0') goto LAB_00803f89;
          pEVar4 = curr->ifFalse;
          local_5e0 = 0;
          local_5f0[0] = 0;
          local_5d0 = (undefined1  [16])0x0;
          puVar22 = local_5f0;
          puVar23 = (undefined8 *)&stack0xfffffffffffff9c8;
          for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
            *puVar23 = *puVar22;
            puVar22 = puVar22 + (ulong)bVar24 * -2 + 1;
            puVar23 = puVar23 + (ulong)bVar24 * -2 + 1;
          }
          matcher_00._8_8_ = in_stack_fffffffffffff9d0;
          matcher_00.binder = (matched_t<wasm::Const_*> *)in_stack_fffffffffffff9c8;
          matcher_00.submatchers.curr.binder =
               (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
               in_stack_fffffffffffff9d8;
          matcher_00.submatchers.curr._8_8_ = in_stack_fffffffffffff9e0;
          matcher_00.submatchers.curr.submatchers.curr.binder =
               (matched_t<wasm::Match::Internal::ExactKind<long>_> *)in_stack_fffffffffffff9e8;
          matcher_00.submatchers.curr.submatchers.curr.data = in_stack_fffffffffffff9f0;
          matcher_00.submatchers.curr.submatchers.curr._16_8_ = in_stack_fffffffffffff9f8;
          matcher_00.submatchers.curr.submatchers._24_8_ = in_stack_fffffffffffffa00;
          matcher_00.submatchers._48_8_ = in_stack_fffffffffffffa08;
          bVar11 = Match::
                   matches<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                             (pEVar4,matcher_00);
          if (bVar11) goto LAB_00803f89;
        }
        else {
LAB_00803f89:
          local_2e8 = (undefined1  [8])0x0;
          local_2d8._0_8_ =
               (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_2c8._8_8_;
          local_2c8 = (Matcher<wasm::Match::Internal::ExactKind<int>_>)(auVar6 << 0x40);
          if (curr->ifTrue->_id == ConstId) {
            Literal::Literal((Literal *)local_4e8,(Literal *)(curr->ifTrue + 1));
            builder.wasm._7_1_ =
                 Match::Internal::
                 Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                 ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                            *)local_2d8,
                           (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                            *)local_4e8);
            Literal::~Literal((Literal *)local_4e8);
            if (builder.wasm._7_1_ != '\0') goto LAB_00804060;
          }
          local_530 = 0;
          local_520 = 0;
          matcher._8_8_ = uStack_538;
          matcher.binder = (matched_t<wasm::Const_*> *)local_2e8;
          matcher.submatchers.curr.binder =
               (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
          matcher.submatchers.curr._8_8_ = uStack_528;
          matcher.submatchers.curr.submatchers.curr.binder =
               (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
          matcher.submatchers.curr.submatchers.curr._8_8_ = uStack_518;
          matcher.submatchers.curr.submatchers._16_8_ = local_510;
          matcher.submatchers._40_8_ = uStack_508;
          local_540 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                       *)local_2e8;
          bVar11 = Match::
                   matches<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                             (curr->ifFalse,matcher);
          if ((!bVar11) ||
             (bVar11 = Literal::isZero((((Literals *)((long)local_2e8 + 8))->
                                       super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems),
             bVar11)) goto LAB_00804060;
        }
        pEVar16[1]._id = (Id)local_48;
        uVar1 = curr->ifTrue;
        uVar2 = curr->ifFalse;
        auVar25._8_4_ = (int)uVar1;
        auVar25._0_8_ = uVar2;
        auVar25._12_4_ = (int)((ulong)uVar1 >> 0x20);
        curr->ifTrue = (Expression *)uVar2;
        curr->ifFalse = (Expression *)auVar25._8_8_;
      }
LAB_00804060:
      if (((((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id ==
             2) && (IVar14 = Bits::getMaxBits<wasm::OptimizeInstructions>(curr->condition,this),
                   IVar14 < 2)) &&
          (IVar14 = Bits::getMaxBits<wasm::OptimizeInstructions>(curr->ifTrue,this), IVar14 < 2)) &&
         (IVar14 = Bits::getMaxBits<wasm::OptimizeInstructions>(curr->ifFalse,this), IVar14 < 2)) {
        local_4e8 = (undefined1  [8])local_150;
        local_2d8._0_8_ =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
        local_2e8 = (undefined1  [8])0x0;
        local_2c8.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
        local_2c8.data = 0;
        local_2c8._12_4_ = 0;
        local_e0 = (undefined1  [8])&bin;
        local_348 = 0;
        auVar7._8_8_ = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                        *)local_4e8;
        auVar7._0_8_ = uStack_340;
        auVar7._16_8_ =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)local_2e8;
        auVar7._24_8_ = local_e0;
        auVar7._32_8_ = uStack_320;
        auVar7._40_8_ = 0;
        local_338 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)local_4e8;
        pMStack_330 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                       *)local_2e8;
        local_328 = local_e0;
        bVar11 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                           ((Expression *)curr,
                            (Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                             )(auVar7 << 0x40));
        if (bVar11) {
          BVar13 = AndInt32;
LAB_00804312:
          pBVar20 = Builder::makeBinary(&local_40,BVar13,(Expression *)local_150,(Expression *)bin);
          return (Expression *)pBVar20;
        }
        local_2d8._0_8_ =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
        local_2c8 = (Matcher<wasm::Match::Internal::ExactKind<int>_>)(ZEXT816(1) << 0x40);
        local_2e8 = (undefined1  [8])0x0;
        local_4e8 = (undefined1  [8])local_150;
        local_e0 = (undefined1  [8])&bin;
        local_318 = 0;
        auVar8._8_8_ = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                        *)local_2e8;
        auVar8._0_8_ = uStack_310;
        auVar8._16_8_ =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)local_4e8;
        auVar8._24_8_ = local_e0;
        auVar8._32_8_ = uStack_2f0;
        auVar8._40_8_ = 0;
        local_308 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                     *)local_2e8;
        pMStack_300 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                       *)local_4e8;
        local_2f8 = local_e0;
        bVar11 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                           ((Expression *)curr,
                            (Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                             )(auVar8 << 0x40));
        if (bVar11) {
          BVar13 = OrInt32;
          goto LAB_00804312;
        }
      }
      local_2d8._0_8_ =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_2c8 = (Matcher<wasm::Match::Internal::ExactKind<int>_>)
                  (ZEXT816(0xffffffffffffffff) << 0x40);
      local_2e8 = (undefined1  [8])0x0;
      local_4e8 = (undefined1  [8])0x0;
      local_f8 = &local_560;
      local_560.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
      local_d0.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)0x0;
      local_e0 = (undefined1  [8])0x0;
      local_d0.next.next =
           (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            )0x0;
      local_78[0].next.curr =
           (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
            *)local_108;
      x._0_4_ = 0x16;
      local_f0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                  *)local_e0;
      bin = (Binary *)0x0;
      local_108 = (undefined1  [8])&local_98;
      local_78[0].curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            *)local_4e8;
      if (((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id ==
           SelectId) && (curr->ifTrue->_id == ConstId)) {
        local_80 = (undefined1  [8])local_2e8;
        Literal::Literal((Literal *)local_150,(Literal *)(curr->ifTrue + 1));
        bVar11 = Match::Internal::
                 Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                 ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                            *)local_2d8,(Literal *)local_150);
        Literal::~Literal((Literal *)local_150);
        if ((!bVar11) ||
           (bVar11 = Match::Internal::
                     Components<wasm::Select_*,_1,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                     ::match(curr,local_78), !bVar11)) goto LAB_0080441a;
LAB_0080451e:
        piVar5 = *(int **)(local_98 + 2);
        if (*piVar5 != 0xe) {
LAB_008047b6:
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                        ,0x314,"T *wasm::Expression::cast() [T = wasm::Const]");
        }
        local_4e8 = (undefined1  [8])(curr->ifTrue->type).id;
        if (local_4e8 == (undefined1  [8])*(ulong *)(piVar5 + 2)) {
          (local_98->type).id = (uintptr_t)local_4e8;
          if ((ulong)local_4e8 < 7) {
            local_98[1]._id = *(Id *)(&DAT_00b7be14 + (long)local_4e8 * 4);
            uVar15 = wasm::Type::getByteSize((Type *)local_4e8);
            Literal::makeFromInt32((Literal *)local_2e8,uVar15 * 8 + -1,(Type)local_4e8);
            Literal::operator=((Literal *)(piVar5 + 4),(Literal *)local_2e8);
            Literal::~Literal((Literal *)local_2e8);
            Literal::makeOne((Literal *)local_2e8,(Type)local_4e8);
            if (curr->ifTrue->_id != ConstId) goto LAB_008047b6;
            Literal::operator=((Literal *)(curr->ifTrue + 1),(Literal *)local_2e8);
            Literal::~Literal((Literal *)local_2e8);
            if ((ulong)local_4e8 < 7) {
              BVar13 = *(BinaryOp *)(&DAT_00b7be30 + (long)local_4e8 * 4);
              pEVar16 = curr->ifTrue;
              pBVar20 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
              (pBVar20->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                   BinaryId;
              (pBVar20->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id
                   = 0;
              pBVar20->op = BVar13;
              pBVar20->left = local_98;
              pBVar20->right = pEVar16;
              Binary::finalize(pBVar20);
              return (Expression *)pBVar20;
            }
          }
          __assert_fail("isBasic() && \"Basic type expected\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                        ,0xc6,"BasicType wasm::Type::getBasic() const");
        }
      }
      else {
LAB_0080441a:
        local_80 = (undefined1  [8])0x0;
        local_78[0].next.curr =
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              *)0x0;
        local_78[0].next._8_8_ = 1;
        bin = (Binary *)0x0;
        local_140.i64 = 0;
        local_130.id = 0;
        local_128 = (pointer)0xffffffffffffffff;
        local_150 = (undefined1  [8])0x0;
        local_168 = local_550;
        local_550[0] = 0;
        local_160 = local_5a8;
        local_5a8._16_8_ =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_5a8._0_8_ = (matched_t<wasm::Const_*> *)0x0;
        local_5a8._32_16_ = (undefined1  [16])0x0;
        local_360.next.curr =
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              *)local_178;
        y._0_4_ = 0x1c;
        local_378._0_8_ = (undefined1 *)0x0;
        local_378._16_8_ = &bin;
        local_360.curr =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)local_150;
        local_178 = (undefined1  [8])&local_98;
        if (((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id ==
             SelectId) && (curr->ifTrue->_id == ConstId)) {
          Literal::Literal(&local_500,(Literal *)(curr->ifTrue + 1));
          bVar11 = Match::Internal::
                   Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                   ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                              *)local_80,&local_500);
          Literal::~Literal(&local_500);
          if ((bVar11) &&
             (bVar11 = Match::Internal::
                       Components<wasm::Select_*,_1,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                       ::match(curr,&local_360), bVar11)) goto LAB_0080451e;
        }
      }
      if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id !=
          SelectId) {
        return (Expression *)0x0;
      }
      pEVar16 = curr->condition;
      if ((pEVar16->_id == UnaryId) && (pEVar16[1]._id == MemorySizeId)) {
        pEVar4 = curr->ifTrue;
        b = curr->ifFalse;
        pEVar16 = (Expression *)pEVar16[1].type.id;
        bVar11 = EffectAnalyzer::canReorder
                           (&((this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).super_Pass.runner)->options,
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .currModule,pEVar4,b);
        if (bVar11) {
          curr->ifTrue = b;
          curr->ifFalse = pEVar4;
          curr->condition = pEVar16;
          return (Expression *)curr;
        }
        if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id !=
            SelectId) {
          return (Expression *)0x0;
        }
      }
      pBVar18 = (Block *)curr->ifTrue;
      pEVar16 = curr->condition;
      bVar11 = ExpressionAnalyzer::equal((Expression *)pBVar18,curr->ifFalse);
      if (!bVar11) {
        return (Expression *)0x0;
      }
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_2e8,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,(Expression *)pBVar18);
      if ((local_1f8 != false) ||
         (bVar11 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_2e8), bVar11)) {
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2e8);
        return (Expression *)0x0;
      }
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_4e8,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,pEVar16);
      if ((local_3f8 != false) ||
         (bVar11 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_4e8), bVar11)) {
        bVar11 = EffectAnalyzer::invalidates
                           ((EffectAnalyzer *)local_4e8,(EffectAnalyzer *)local_2e8);
        if (bVar11) {
          bVar11 = true;
          goto LAB_00804791;
        }
        pDVar17 = Builder::makeDrop(&local_40,pEVar16);
        pBVar18 = Builder::makeSequence(&local_40,(Expression *)pDVar17,(Expression *)pBVar18);
      }
      bVar11 = false;
LAB_00804791:
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_4e8);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2e8);
      if (bVar11) {
        return (Expression *)0x0;
      }
      return (Expression *)pBVar18;
    }
  }
  IVar12 = (((SpecificExpression<(wasm::Expression::Id)16> *)local_150)->super_Expression)._id;
  if ((int)IVar12 < 0x2c) {
    if (IVar12 == UnaryId) {
      bVar11 = Unary::isRelational((Unary *)local_150);
    }
    else {
      if (IVar12 != BinaryId) {
        if (IVar12 == RefIsNullId) goto LAB_0080421a;
        goto LAB_00804192;
      }
      bVar11 = Binary::isRelational((Binary *)local_150);
    }
    if (bVar11 != false) goto LAB_0080421a;
  }
  else if (((IVar12 == RefEqId) || (IVar12 == RefTestId)) ||
          ((IVar12 == StringEqId &&
           ((((Literals *)((long)local_150 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
            _M_elems[0].field_0.i32 == 0)))) goto LAB_0080421a;
LAB_00804192:
  auVar10 = local_150;
  this_00._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
  (((SpecificExpression<(wasm::Expression::Id)15> *)&(this_00._M_pi)->_vptr__Sp_counted_base)->
  super_Expression)._id = UnaryId;
  *(uintptr_t *)
   &((SpecificExpression<(wasm::Expression::Id)15> *)&(this_00._M_pi)->_M_use_count)->
    super_Expression = 0;
  *(UnaryOp *)(this_00._M_pi + 1) = EqZInt32;
  *(undefined1 (*) [8])((long)(this_00._M_pi + 1) + 8) = auVar10;
  Unary::finalize((Unary *)this_00._M_pi);
  this_01 = (element_type *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
  (((SpecificExpression<(wasm::Expression::Id)15> *)&this_01->type)->super_Expression)._id = UnaryId
  ;
  *(uintptr_t *)
   &((SpecificExpression<(wasm::Expression::Id)15> *)&this_01->values)->super_Expression = 0;
  *(UnaryOp *)((array<wasm::Literal,_1UL> *)((long)&this_01->values + 8))->_M_elems = EqZInt32;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((array<wasm::Literal,_1UL> *)((long)&this_01->values + 0x10))->_M_elems = this_00._M_pi;
  Unary::finalize((Unary *)this_01);
  local_150 = (undefined1  [8])this_01;
LAB_0080421a:
  auVar10 = local_150;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id == 3) {
    pUVar19 = (Unary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
    (pUVar19->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar19->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar19->op = ExtendUInt32;
    pUVar19->value = (Expression *)auVar10;
    Unary::finalize(pUVar19);
    return (Expression *)pUVar19;
  }
  return (Expression *)(Binary *)local_150;
}

Assistant:

Expression* optimizeSelect(Select* curr) {
    using namespace Match;
    using namespace Abstract;
    Builder builder(*getModule());
    curr->condition = optimizeBoolean(curr->condition);
    {
      // Constant condition, we can just pick the correct side (barring side
      // effects)
      Expression *ifTrue, *ifFalse;
      if (matches(curr, select(pure(&ifTrue), any(&ifFalse), i32(0)))) {
        return ifFalse;
      }
      if (matches(curr, select(any(&ifTrue), any(&ifFalse), i32(0)))) {
        return builder.makeSequence(builder.makeDrop(ifTrue), ifFalse);
      }
      int32_t cond;
      if (matches(curr, select(any(&ifTrue), pure(&ifFalse), i32(&cond)))) {
        // The condition must be non-zero because a zero would have matched one
        // of the previous patterns.
        assert(cond != 0);
        return ifTrue;
      }
      // Don't bother when `ifFalse` isn't pure - we would need to reverse the
      // order using a temp local, which would be bad
    }
    {
      // TODO: Remove this after landing SCCP pass. See: #4161

      // i32(x) ? i32(x) : 0  ==>  x
      Expression *x, *y;
      if (matches(curr, select(any(&x), i32(0), any(&y))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return curr->ifTrue;
      }
      // i32(x) ? 0 : i32(x)  ==>  { x, 0 }
      if (matches(curr, select(i32(0), any(&x), any(&y))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return builder.makeSequence(builder.makeDrop(x), curr->ifTrue);
      }

      // i64(x) == 0 ? 0 : i64(x)  ==>  x
      // i64(x) != 0 ? i64(x) : 0  ==>  x
      if ((matches(curr, select(i64(0), any(&x), unary(EqZInt64, any(&y)))) ||
           matches(
             curr,
             select(any(&x), i64(0), binary(NeInt64, any(&y), i64(0))))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return curr->condition->is<Unary>() ? curr->ifFalse : curr->ifTrue;
      }

      // i64(x) == 0 ? i64(x) : 0  ==>  { x, 0 }
      // i64(x) != 0 ? 0 : i64(x)  ==>  { x, 0 }
      if ((matches(curr, select(any(&x), i64(0), unary(EqZInt64, any(&y)))) ||
           matches(
             curr,
             select(i64(0), any(&x), binary(NeInt64, any(&y), i64(0))))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return builder.makeSequence(
          builder.makeDrop(x),
          curr->condition->is<Unary>() ? curr->ifFalse : curr->ifTrue);
      }
    }
    {
      // Simplify selects between 0 and 1
      Expression* c;
      bool reversed = matches(curr, select(ival(0), ival(1), any(&c)));
      if (reversed || matches(curr, select(ival(1), ival(0), any(&c)))) {
        if (reversed) {
          c = optimizeBoolean(builder.makeUnary(EqZInt32, c));
        }
        if (!Properties::emitsBoolean(c)) {
          // cond ? 1 : 0 ==> !!cond
          c = builder.makeUnary(EqZInt32, builder.makeUnary(EqZInt32, c));
        }
        return curr->type == Type::i64 ? builder.makeUnary(ExtendUInt32, c) : c;
      }
    }
    // Flip the arms if doing so might help later optimizations here.
    if (auto* binary = curr->condition->dynCast<Binary>()) {
      auto inv = invertBinaryOp(binary->op);
      if (inv != InvalidBinary) {
        // For invertible binary operations, we prefer to have non-zero values
        // in the ifTrue, and zero values in the ifFalse, due to the
        // optimization right after us. Even if this does not help there, it is
        // a nice canonicalization. (To ensure convergence - that we don't keep
        // doing work each time we get here - do nothing if both are zero, or
        // if both are nonzero.)
        Const* c;
        if ((matches(curr->ifTrue, ival(0)) &&
             !matches(curr->ifFalse, ival(0))) ||
            (!matches(curr->ifTrue, ival()) &&
             matches(curr->ifFalse, ival(&c)) && !c->value.isZero())) {
          binary->op = inv;
          std::swap(curr->ifTrue, curr->ifFalse);
        }
      }
    }
    if (curr->type == Type::i32 &&
        Bits::getMaxBits(curr->condition, this) <= 1 &&
        Bits::getMaxBits(curr->ifTrue, this) <= 1 &&
        Bits::getMaxBits(curr->ifFalse, this) <= 1) {
      // The condition and both arms are i32 booleans, which allows us to do
      // boolean optimizations.
      Expression* x;
      Expression* y;

      // x ? y : 0   ==>   x & y
      if (matches(curr, select(any(&y), ival(0), any(&x)))) {
        return builder.makeBinary(AndInt32, y, x);
      }

      // x ? 1 : y   ==>   x | y
      if (matches(curr, select(ival(1), any(&y), any(&x)))) {
        return builder.makeBinary(OrInt32, y, x);
      }
    }
    {
      // Simplify x < 0 ? -1 : 1 or x >= 0 ? 1 : -1 to
      // i32(x) >> 31 | 1
      // i64(x) >> 63 | 1
      Binary* bin;
      if (matches(
            curr,
            select(ival(-1), ival(1), binary(&bin, LtS, any(), ival(0)))) ||
          matches(
            curr,
            select(ival(1), ival(-1), binary(&bin, GeS, any(), ival(0))))) {
        auto c = bin->right->cast<Const>();
        auto type = curr->ifTrue->type;
        if (type == c->type) {
          bin->type = type;
          bin->op = Abstract::getBinary(type, ShrS);
          c->value = Literal::makeFromInt32(type.getByteSize() * 8 - 1, type);
          curr->ifTrue->cast<Const>()->value = Literal::makeOne(type);
          return builder.makeBinary(
            Abstract::getBinary(type, Or), bin, curr->ifTrue);
        }
      }
    }
    {
      // Flip select to remove eqz if we can reorder
      Select* s;
      Expression *ifTrue, *ifFalse, *c;
      if (matches(
            curr,
            select(
              &s, any(&ifTrue), any(&ifFalse), unary(EqZInt32, any(&c)))) &&
          canReorder(ifTrue, ifFalse)) {
        s->ifTrue = ifFalse;
        s->ifFalse = ifTrue;
        s->condition = c;
        return s;
      }
    }
    {
      // Sides are identical, fold
      Expression *ifTrue, *ifFalse, *c;
      if (matches(curr, select(any(&ifTrue), any(&ifFalse), any(&c))) &&
          ExpressionAnalyzer::equal(ifTrue, ifFalse)) {
        auto value = effects(ifTrue);
        if (value.hasSideEffects()) {
          // At best we don't need the condition, but need to execute the
          // value twice. a block is larger than a select by 2 bytes, and we
          // must drop one value, so 3, while we save the condition, so it's
          // not clear this is worth it, TODO
        } else {
          // The value has no side effects, so we can replace ourselves with one
          // of the two identical values in the arms.
          auto condition = effects(c);
          if (!condition.hasSideEffects()) {
            return ifTrue;
          } else {
            // The condition is last, so we need a new local, and it may be a
            // bad idea to use a block like we do for an if. Do it only if we
            // can reorder
            if (!condition.invalidates(value)) {
              return builder.makeSequence(builder.makeDrop(c), ifTrue);
            }
          }
        }
      }
    }
    return nullptr;
  }